

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::Swap
          (RepeatedField<double> *this,RepeatedField<double> *other)

{
  Arena *this_00;
  Arena *pAVar1;
  long in_RSI;
  long in_RDI;
  RepeatedField<double> temp;
  RepeatedField<double> *in_stack_00000078;
  RepeatedField<double> *in_stack_00000080;
  RepeatedField<double> *this_01;
  RepeatedField<double> *in_stack_ffffffffffffffc0;
  RepeatedField<double> local_20 [2];
  
  if (in_RDI != in_RSI) {
    this_00 = GetArenaNoVirtual(in_stack_ffffffffffffffc0);
    pAVar1 = GetArenaNoVirtual((RepeatedField<double> *)this_00);
    if (this_00 == pAVar1) {
      InternalSwap(in_stack_00000080,in_stack_00000078);
    }
    else {
      pAVar1 = GetArenaNoVirtual((RepeatedField<double> *)this_00);
      this_01 = local_20;
      RepeatedField(this_01,pAVar1);
      MergeFrom(this,other);
      CopyFrom((RepeatedField<double> *)this_00,this_01);
      UnsafeArenaSwap((RepeatedField<double> *)this_00,this_01);
      ~RepeatedField((RepeatedField<double> *)this_00);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArenaNoVirtual());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}